

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O0

llama_token __thiscall mtmd_context::lookup_token(mtmd_context *this,string *token_text)

{
  __type _Var1;
  int iVar2;
  undefined8 uVar3;
  long in_RDI;
  bool in_stack_0000000b;
  llama_token in_stack_0000000c;
  llama_vocab *in_stack_00000010;
  mtmd_context *in_stack_00000018;
  int i;
  int n_vocab;
  llama_vocab *vocab;
  string local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  int local_28;
  
  uVar3 = llama_model_get_vocab(*(undefined8 *)(in_RDI + 8));
  iVar2 = llama_vocab_n_tokens(uVar3);
  local_28 = 0;
  while( true ) {
    if (iVar2 <= local_28) {
      return -1;
    }
    token_to_piece_abi_cxx11_
              (in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
    _Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string(local_48);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

llama_token lookup_token(const std::string & token_text) {
        const llama_vocab * vocab = llama_model_get_vocab(text_model);
        const int n_vocab = llama_vocab_n_tokens(vocab);
        for (int i = 0; i < n_vocab; i++) {
            if (token_to_piece(vocab, i, true) == token_text) {
                return i;
            }
        }
        return LLAMA_TOKEN_NULL;
    }